

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_conserve.cpp
# Opt level: O1

Reals Omega_h::diffuse_integrals_weighted
                (Mesh *mesh,Graph *g,Reals *error_integrals,Reals *quantity_integrals,
                VarCompareOpts opts,string *name,bool verbose)

{
  long *plVar1;
  void **ppvVar2;
  int *piVar3;
  Alloc *pAVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  _Alloc_hider _Var6;
  undefined8 uVar7;
  element_type *peVar8;
  element_type *peVar9;
  Reals *pRVar10;
  uint uVar11;
  char cVar12;
  LO b;
  int ncomps;
  uint uVar13;
  I32 IVar14;
  undefined8 *puVar15;
  ostream *poVar16;
  ulong uVar17;
  Reals *extraout_RDX;
  Reals *extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  Reals *extraout_RDX_07;
  Reals *extraout_RDX_08;
  Alloc *pAVar18;
  undefined7 in_register_00000089;
  uint __len;
  uint __val;
  size_t sVar19;
  Comm *pCVar20;
  bool bVar21;
  Reals RVar22;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> comp_name;
  Read<double> comp_integrals;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  Read<double> weighted_sizes;
  Write<double> out;
  Read<double> comp_quantity_integrals;
  Reals weighted_densities;
  string __str_1;
  string local_2a8;
  element_type *local_280;
  shared_ptr<const_Omega_h::TagBase> local_278;
  Comm *local_268;
  element_type *peStack_260;
  undefined1 local_258 [40];
  Reals *local_230;
  Alloc *local_228;
  Alloc *local_220;
  Omega_h *local_218;
  undefined8 local_210;
  Write<double> local_208;
  Comm *local_1f8;
  element_type *local_1f0;
  undefined1 local_1e8 [16];
  Alloc *local_1d8;
  pointer local_1d0;
  undefined1 local_1c8 [56];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_190;
  Alloc *local_188;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_180;
  Alloc *local_178;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_170;
  element_type *local_168;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_160;
  element_type *local_158;
  Read<double> local_150;
  Read<double> local_140;
  Write<double> local_130;
  Read<double> local_120;
  Write<double> local_110;
  string local_100;
  Read<double> local_e0;
  Read<double> local_d0;
  Reals local_c0;
  Reals local_b0;
  Reals local_a0;
  Reals local_90;
  Read<double> local_80;
  Reals local_70;
  Alloc *local_60;
  Alloc *local_58;
  Write<double> local_50;
  Read<double> local_40;
  
  local_158 = (element_type *)CONCAT71(in_register_00000089,verbose);
  pAVar18 = (quantity_integrals->write_).shared_alloc_.alloc;
  if (opts.type == NONE) {
    *(Alloc **)mesh = pAVar18;
    (mesh->comm_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(quantity_integrals->write_).shared_alloc_.direct_ptr;
    if ((((ulong)pAVar18 & 7) == 0 && pAVar18 != (Alloc *)0x0) && (entering_parallel == '\x01')) {
      pAVar18->use_count = pAVar18->use_count + -1;
      *(size_t *)mesh = pAVar18->size * 8 + 1;
    }
    (quantity_integrals->write_).shared_alloc_.alloc = (Alloc *)0x0;
    (quantity_integrals->write_).shared_alloc_.direct_ptr = (void *)0x0;
  }
  else {
    if (((ulong)pAVar18 & 1) == 0) {
      sVar19 = pAVar18->size;
    }
    else {
      sVar19 = (ulong)pAVar18 >> 3;
    }
    local_280 = (element_type *)name;
    local_1c8._24_8_ = g;
    b = Graph::nnodes((Graph *)error_integrals);
    ncomps = divide_no_remainder<int>((int)(sVar19 >> 3),b);
    local_230 = quantity_integrals;
    local_160._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)mesh;
    if (ncomps < 2) {
      local_40.write_.shared_alloc_.alloc = (Alloc *)((_Alloc_hider *)&local_280->library_)->_M_p;
      if (((ulong)local_40.write_.shared_alloc_.alloc & 7) == 0 &&
          local_40.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_40.write_.shared_alloc_.alloc =
               (Alloc *)((local_40.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_40.write_.shared_alloc_.alloc)->use_count =
               (local_40.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_40.write_.shared_alloc_.direct_ptr = (local_280->srcs_).write_.shared_alloc_.alloc;
      local_218 = (Omega_h *)&local_228;
      fabs_each(local_218,&local_40);
      pAVar18 = local_40.write_.shared_alloc_.alloc;
      if (((ulong)local_40.write_.shared_alloc_.alloc & 7) == 0 &&
          local_40.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)local_40.write_.shared_alloc_.alloc + 0x30);
        *(int *)&p_Var5->_vptr__Sp_counted_base = *(int *)&p_Var5->_vptr__Sp_counted_base + -1;
        if (*(int *)&p_Var5->_vptr__Sp_counted_base == 0) {
          Alloc::~Alloc(local_40.write_.shared_alloc_.alloc);
          operator_delete(pAVar18,0x48);
        }
      }
      local_80.write_.shared_alloc_.alloc = local_228;
      if (((ulong)local_228 & 7) == 0 && local_228 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_80.write_.shared_alloc_.alloc = (Alloc *)(local_228->size * 8 + 1);
        }
        else {
          local_228->use_count = local_228->use_count + 1;
        }
      }
      local_80.write_.shared_alloc_.direct_ptr = local_220;
      each_max_with<double>((Omega_h *)&local_2a8,&local_80,opts.floor);
      if (((ulong)local_228 & 7) == 0 && local_228 != (Alloc *)0x0) {
        piVar3 = &local_228->use_count;
        *piVar3 = *piVar3 + -1;
        if (*piVar3 == 0) {
          Alloc::~Alloc(local_228);
          operator_delete(local_228,0x48);
        }
      }
      pAVar18 = local_80.write_.shared_alloc_.alloc;
      local_228 = (Alloc *)local_2a8._M_dataplus._M_p;
      local_220 = (Alloc *)local_2a8._M_string_length;
      if ((((ulong)local_2a8._M_dataplus._M_p & 7) == 0 &&
           (Alloc *)local_2a8._M_dataplus._M_p != (Alloc *)0x0) && (entering_parallel == '\x01')) {
        *(int *)(local_2a8._M_dataplus._M_p + 0x30) =
             *(int *)(local_2a8._M_dataplus._M_p + 0x30) + -1;
        local_228 = (Alloc *)(*(long *)local_2a8._M_dataplus._M_p * 8 + 1);
      }
      local_2a8._M_dataplus._M_p = (pointer)0x0;
      local_2a8._M_string_length = 0;
      if (((ulong)local_80.write_.shared_alloc_.alloc & 7) == 0 &&
          local_80.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar3 = &(local_80.write_.shared_alloc_.alloc)->use_count;
        *piVar3 = *piVar3 + -1;
        if (*piVar3 == 0) {
          Alloc::~Alloc(local_80.write_.shared_alloc_.alloc);
          operator_delete(pAVar18,0x48);
        }
      }
      local_90.write_.shared_alloc_.alloc = (local_230->write_).shared_alloc_.alloc;
      if (((ulong)local_90.write_.shared_alloc_.alloc & 7) == 0 &&
          local_90.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_90.write_.shared_alloc_.alloc =
               (Alloc *)((local_90.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_90.write_.shared_alloc_.alloc)->use_count =
               (local_90.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_90.write_.shared_alloc_.direct_ptr = (local_230->write_).shared_alloc_.direct_ptr;
      local_a0.write_.shared_alloc_.alloc = local_228;
      if (((ulong)local_228 & 7) == 0 && local_228 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_a0.write_.shared_alloc_.alloc = (Alloc *)(local_228->size * 8 + 1);
        }
        else {
          local_228->use_count = local_228->use_count + 1;
        }
      }
      local_a0.write_.shared_alloc_.direct_ptr = local_220;
      local_168 = (element_type *)local_1e8;
      divide_each_maybe_zero((Omega_h *)local_168,&local_90,&local_a0);
      pAVar18 = local_a0.write_.shared_alloc_.alloc;
      if (((ulong)local_a0.write_.shared_alloc_.alloc & 7) == 0 &&
          local_a0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar3 = &(local_a0.write_.shared_alloc_.alloc)->use_count;
        *piVar3 = *piVar3 + -1;
        if (*piVar3 == 0) {
          Alloc::~Alloc(local_a0.write_.shared_alloc_.alloc);
          operator_delete(pAVar18,0x48);
        }
      }
      pAVar18 = local_90.write_.shared_alloc_.alloc;
      if (((ulong)local_90.write_.shared_alloc_.alloc & 7) == 0 &&
          local_90.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar3 = &(local_90.write_.shared_alloc_.alloc)->use_count;
        *piVar3 = *piVar3 + -1;
        if (*piVar3 == 0) {
          Alloc::~Alloc(local_90.write_.shared_alloc_.alloc);
          operator_delete(pAVar18,0x48);
        }
      }
      local_188 = (error_integrals->write_).shared_alloc_.alloc;
      if (((ulong)local_188 & 7) == 0 && local_188 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_188 = (Alloc *)(local_188->size * 8 + 1);
        }
        else {
          local_188->use_count = local_188->use_count + 1;
        }
      }
      local_180._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (error_integrals->write_).shared_alloc_.direct_ptr;
      local_178 = error_integrals[1].write_.shared_alloc_.alloc;
      if (((ulong)local_178 & 7) == 0 && local_178 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_178 = (Alloc *)(local_178->size * 8 + 1);
        }
        else {
          local_178->use_count = local_178->use_count + 1;
        }
      }
      local_170._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           error_integrals[1].write_.shared_alloc_.direct_ptr;
      local_268 = (Comm *)local_1e8._0_8_;
      if ((local_1e8._0_8_ & 7) == 0 && (Comm *)local_1e8._0_8_ != (Comm *)0x0) {
        if (entering_parallel == '\x01') {
          local_268 = (Comm *)((long)*(Library **)local_1e8._0_8_ * 8 + 1);
        }
        else {
          ppvVar2 = &(((HostRead<int> *)(local_1e8._0_8_ + 0x28))->read_).write_.shared_alloc_.
                     direct_ptr;
          *(int *)ppvVar2 = *(int *)ppvVar2 + 1;
        }
      }
      peStack_260 = (element_type *)local_1e8._8_8_;
      local_1c8._32_8_ = local_228;
      if (((ulong)local_228 & 7) == 0 && local_228 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_1c8._32_8_ = local_228->size * 8 + 1;
        }
        else {
          local_228->use_count = local_228->use_count + 1;
        }
      }
      local_1c8._40_8_ = local_220;
      local_1c8._16_8_ = opts.tolerance;
      Mesh::comm((Mesh *)local_1c8._24_8_);
      local_210 = (shared_ptr<const_Omega_h::TagBase> *)((ulong)local_210._4_4_ << 0x20);
      while( true ) {
        if (local_1f0 != (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&(local_1f0->srcs_).write_.shared_alloc_.alloc =
                 *(int *)&(local_1f0->srcs_).write_.shared_alloc_.alloc + 1;
            UNLOCK();
          }
          else {
            *(int *)&(local_1f0->srcs_).write_.shared_alloc_.alloc =
                 *(int *)&(local_1f0->srcs_).write_.shared_alloc_.alloc + 1;
          }
        }
        local_1c8._48_8_ = local_268;
        if (((ulong)local_268 & 7) == 0 && local_268 != (Comm *)0x0) {
          if (entering_parallel == '\x01') {
            local_1c8._48_8_ = (long)local_268->library_ * 8 + 1;
          }
          else {
            ppvVar2 = &(local_268->host_srcs_).read_.write_.shared_alloc_.direct_ptr;
            *(int *)ppvVar2 = *(int *)ppvVar2 + 1;
          }
        }
        local_190._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_260;
        local_258._0_8_ = local_1f8;
        local_258._8_8_ = local_1f0;
        if (local_1f0 != (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&(local_1f0->srcs_).write_.shared_alloc_.alloc =
                 *(int *)&(local_1f0->srcs_).write_.shared_alloc_.alloc + 1;
            UNLOCK();
          }
          else {
            *(int *)&(local_1f0->srcs_).write_.shared_alloc_.alloc =
                 *(int *)&(local_1f0->srcs_).write_.shared_alloc_.alloc + 1;
          }
        }
        local_278.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_1c8._48_8_;
        if ((local_1c8._48_8_ & 7) == 0 && (Comm *)local_1c8._48_8_ != (Comm *)0x0) {
          if (entering_parallel == '\x01') {
            local_278.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 = (element_type *)((long)*(Library **)local_1c8._48_8_ * 8 + 1);
          }
          else {
            ppvVar2 = &(((HostRead<int> *)(local_1c8._48_8_ + 0x28))->read_).write_.shared_alloc_.
                       direct_ptr;
            *(int *)ppvVar2 = *(int *)ppvVar2 + 1;
          }
        }
        local_280 = local_1f0;
        local_278.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_260;
        fabs_each((Omega_h *)&local_208,(Read<double> *)&local_278);
        each_leq_to<double>((Omega_h *)&local_1d8,(Read<double> *)&local_208,
                            (double)local_1c8._16_8_);
        cVar12 = get_min<signed_char>((CommPtr *)local_258,(Read<signed_char> *)&local_1d8);
        pAVar18 = local_1d8;
        if (((ulong)local_1d8 & 7) == 0 && local_1d8 != (Alloc *)0x0) {
          piVar3 = &local_1d8->use_count;
          *piVar3 = *piVar3 + -1;
          if (*piVar3 == 0) {
            Alloc::~Alloc(local_1d8);
            operator_delete(pAVar18,0x48);
          }
        }
        pAVar18 = local_208.shared_alloc_.alloc;
        if (((ulong)local_208.shared_alloc_.alloc & 7) == 0 &&
            local_208.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar3 = &(local_208.shared_alloc_.alloc)->use_count;
          *piVar3 = *piVar3 + -1;
          if (*piVar3 == 0) {
            Alloc::~Alloc(local_208.shared_alloc_.alloc);
            operator_delete(pAVar18,0x48);
          }
        }
        peVar8 = local_278.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        if (((ulong)local_278.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr & 7) == 0 &&
            (Comm *)local_278.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr != (Comm *)0x0) {
          ppvVar2 = &(((HostRead<int> *)
                      &(local_278.
                        super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->ncomps_)->read_).write_.shared_alloc_.direct_ptr;
          *(int *)ppvVar2 = *(int *)ppvVar2 + -1;
          if (*(int *)ppvVar2 == 0) {
            Alloc::~Alloc((Alloc *)local_278.
                                   super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
            operator_delete(peVar8,0x48);
          }
        }
        if ((element_type *)local_258._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_);
        }
        uVar7 = local_1c8._48_8_;
        if ((local_1c8._48_8_ & 7) == 0 && (Comm *)local_1c8._48_8_ != (Comm *)0x0) {
          ppvVar2 = &(((HostRead<int> *)(local_1c8._48_8_ + 0x28))->read_).write_.shared_alloc_.
                     direct_ptr;
          *(int *)ppvVar2 = *(int *)ppvVar2 + -1;
          if (*(int *)ppvVar2 == 0) {
            Alloc::~Alloc((Alloc *)local_1c8._48_8_);
            operator_delete((void *)uVar7,0x48);
          }
        }
        if (local_280 != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_280);
        }
        if (cVar12 != '\0') break;
        local_2a8._M_dataplus._M_p = (pointer)local_188;
        if (((ulong)local_188 & 7) == 0 && local_188 != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_2a8._M_dataplus._M_p = (pointer)(local_188->size * 8 + 1);
          }
          else {
            local_188->use_count = local_188->use_count + 1;
          }
        }
        local_2a8._M_string_length = (size_type)local_180._M_pi;
        local_2a8.field_2._M_allocated_capacity = (size_type)local_178;
        if (((ulong)local_178 & 7) == 0 && local_178 != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_2a8.field_2._M_allocated_capacity = local_178->size * 8 + 1;
          }
          else {
            local_178->use_count = local_178->use_count + 1;
          }
        }
        local_2a8.field_2._8_8_ = local_170._M_pi;
        local_b0.write_.shared_alloc_.alloc = (Alloc *)local_268;
        if (((ulong)local_268 & 7) == 0 && local_268 != (Comm *)0x0) {
          if (entering_parallel == '\x01') {
            local_b0.write_.shared_alloc_.alloc = (Alloc *)((long)local_268->library_ * 8 + 1);
          }
          else {
            ppvVar2 = &(local_268->host_srcs_).read_.write_.shared_alloc_.direct_ptr;
            *(int *)ppvVar2 = *(int *)ppvVar2 + 1;
          }
        }
        local_b0.write_.shared_alloc_.direct_ptr = peStack_260;
        local_c0.write_.shared_alloc_.alloc = (Alloc *)local_1c8._32_8_;
        if ((local_1c8._32_8_ & 7) == 0 && (Alloc *)local_1c8._32_8_ != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_c0.write_.shared_alloc_.alloc = (Alloc *)(*(long *)local_1c8._32_8_ * 8 + 1);
          }
          else {
            *(int *)(local_1c8._32_8_ + 0x30) = *(int *)(local_1c8._32_8_ + 0x30) + 1;
          }
        }
        local_c0.write_.shared_alloc_.direct_ptr = (void *)local_1c8._40_8_;
        diffuse_densities_once
                  ((Omega_h *)local_258,(Mesh *)local_1c8._24_8_,(Graph *)&local_2a8,&local_b0,
                   &local_c0);
        pCVar20 = local_268;
        if (((ulong)local_268 & 7) == 0 && local_268 != (Comm *)0x0) {
          ppvVar2 = &(local_268->host_srcs_).read_.write_.shared_alloc_.direct_ptr;
          *(int *)ppvVar2 = *(int *)ppvVar2 + -1;
          if (*(int *)ppvVar2 == 0) {
            Alloc::~Alloc((Alloc *)local_268);
            operator_delete(pCVar20,0x48);
          }
        }
        pAVar18 = local_c0.write_.shared_alloc_.alloc;
        local_268 = (Comm *)local_258._0_8_;
        peStack_260 = (element_type *)local_258._8_8_;
        if (((local_258._0_8_ & 7) == 0 && (Comm *)local_258._0_8_ != (Comm *)0x0) &&
           (entering_parallel == '\x01')) {
          ppvVar2 = &(((HostRead<int> *)(local_258._0_8_ + 0x28))->read_).write_.shared_alloc_.
                     direct_ptr;
          *(int *)ppvVar2 = *(int *)ppvVar2 + -1;
          local_268 = (Comm *)((long)*(Library **)local_258._0_8_ * 8 + 1);
        }
        local_258._0_8_ = (Alloc *)0x0;
        local_258._8_8_ = (element_type *)0x0;
        if (((ulong)local_c0.write_.shared_alloc_.alloc & 7) == 0 &&
            local_c0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar3 = &(local_c0.write_.shared_alloc_.alloc)->use_count;
          *piVar3 = *piVar3 + -1;
          if (*piVar3 == 0) {
            Alloc::~Alloc(local_c0.write_.shared_alloc_.alloc);
            operator_delete(pAVar18,0x48);
          }
        }
        pAVar18 = local_b0.write_.shared_alloc_.alloc;
        if (((ulong)local_b0.write_.shared_alloc_.alloc & 7) == 0 &&
            (Comm *)local_b0.write_.shared_alloc_.alloc != (Comm *)0x0) {
          ppvVar2 = &(((HostRead<int> *)&(local_b0.write_.shared_alloc_.alloc)->ptr)->read_).write_.
                     shared_alloc_.direct_ptr;
          *(int *)ppvVar2 = *(int *)ppvVar2 + -1;
          if (*(int *)ppvVar2 == 0) {
            Alloc::~Alloc(local_b0.write_.shared_alloc_.alloc);
            operator_delete(pAVar18,0x48);
          }
        }
        uVar7 = local_2a8.field_2._M_allocated_capacity;
        if ((local_2a8.field_2._M_allocated_capacity & 7) == 0 &&
            (Alloc *)local_2a8.field_2._M_allocated_capacity != (Alloc *)0x0) {
          piVar3 = (int *)(local_2a8.field_2._M_allocated_capacity + 0x30);
          *piVar3 = *piVar3 + -1;
          if (*piVar3 == 0) {
            Alloc::~Alloc((Alloc *)local_2a8.field_2._M_allocated_capacity);
            operator_delete((void *)uVar7,0x48);
          }
        }
        _Var6._M_p = local_2a8._M_dataplus._M_p;
        if (((ulong)local_2a8._M_dataplus._M_p & 7) == 0 &&
            (Alloc *)local_2a8._M_dataplus._M_p != (Alloc *)0x0) {
          piVar3 = (int *)(local_2a8._M_dataplus._M_p + 0x30);
          *piVar3 = *piVar3 + -1;
          if (*piVar3 == 0) {
            Alloc::~Alloc((Alloc *)local_2a8._M_dataplus._M_p);
            operator_delete(_Var6._M_p,0x48);
          }
        }
        local_210 = (shared_ptr<const_Omega_h::TagBase> *)
                    CONCAT44(local_210._4_4_,(int)local_210 + 1);
      }
      if (((char)comp_name._M_dataplus._M_p != '\0') &&
         (IVar14 = Comm::rank(local_1f8), IVar14 == 0)) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"diffused ",9);
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,
                             (char *)(local_158->super_Graph).a2ab.write_.shared_alloc_.alloc,
                             (long)(local_158->super_Graph).a2ab.write_.shared_alloc_.direct_ptr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16," in ",4);
        poVar16 = (ostream *)std::ostream::operator<<((ostream *)poVar16,(int)local_210);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16," iterations\n",0xc);
      }
      peVar9 = peStack_260;
      pCVar20 = local_268;
      if ((((ulong)local_268 & 7) == 0 && local_268 != (Comm *)0x0) && (entering_parallel == '\x01')
         ) {
        ppvVar2 = &(local_268->host_srcs_).read_.write_.shared_alloc_.direct_ptr;
        *(int *)ppvVar2 = *(int *)ppvVar2 + -1;
        pCVar20 = (Comm *)((long)local_268->library_ * 8 + 1);
      }
      local_268 = (Comm *)0x0;
      peStack_260 = (element_type *)0x0;
      if (local_1f0 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f0);
      }
      if ((local_1e8._0_8_ & 7) == 0 && (Comm *)local_1e8._0_8_ != (Comm *)0x0) {
        ppvVar2 = &(((HostRead<int> *)(local_1e8._0_8_ + 0x28))->read_).write_.shared_alloc_.
                   direct_ptr;
        *(int *)ppvVar2 = *(int *)ppvVar2 + -1;
        if (*(int *)ppvVar2 == 0) {
          Alloc::~Alloc((Alloc *)local_1e8._0_8_);
          operator_delete((void *)local_1e8._0_8_,0x48);
        }
      }
      mesh = (Mesh *)local_160._M_pi;
      uVar7 = local_1c8._32_8_;
      local_1e8._8_8_ = peVar9;
      local_1e8._0_8_ = pCVar20;
      if ((((ulong)pCVar20 & 7) == 0 && pCVar20 != (Comm *)0x0) && (entering_parallel == '\x01')) {
        ppvVar2 = &(pCVar20->host_srcs_).read_.write_.shared_alloc_.direct_ptr;
        *(int *)ppvVar2 = *(int *)ppvVar2 + -1;
        local_1e8._0_8_ = (long)pCVar20->library_ * 8 + 1;
      }
      if ((local_1c8._32_8_ & 7) == 0 && (Alloc *)local_1c8._32_8_ != (Alloc *)0x0) {
        piVar3 = (int *)(local_1c8._32_8_ + 0x30);
        *piVar3 = *piVar3 + -1;
        if (*piVar3 == 0) {
          Alloc::~Alloc((Alloc *)local_1c8._32_8_);
          operator_delete((void *)uVar7,0x48);
        }
      }
      pCVar20 = local_268;
      if (((ulong)local_268 & 7) == 0 && local_268 != (Comm *)0x0) {
        piVar3 = (int *)((long)local_268 + 0x30);
        *piVar3 = *piVar3 + -1;
        if (*piVar3 == 0) {
          Alloc::~Alloc((Alloc *)local_268);
          operator_delete(pCVar20,0x48);
        }
      }
      pAVar18 = local_178;
      if (((ulong)local_178 & 7) == 0 && local_178 != (Alloc *)0x0) {
        piVar3 = &local_178->use_count;
        *piVar3 = *piVar3 + -1;
        if (*piVar3 == 0) {
          Alloc::~Alloc(local_178);
          operator_delete(pAVar18,0x48);
        }
      }
      pAVar18 = local_188;
      if (((ulong)local_188 & 7) == 0 && local_188 != (Alloc *)0x0) {
        piVar3 = &local_188->use_count;
        *piVar3 = *piVar3 + -1;
        if (*piVar3 == 0) {
          Alloc::~Alloc(local_188);
          operator_delete(pAVar18,0x48);
        }
      }
      pRVar10 = local_230;
      local_140.write_.shared_alloc_.alloc = (Alloc *)local_1e8._0_8_;
      if ((local_1e8._0_8_ & 7) == 0 && (Comm *)local_1e8._0_8_ != (Comm *)0x0) {
        if (entering_parallel == '\x01') {
          local_140.write_.shared_alloc_.alloc =
               (Alloc *)((long)*(Library **)local_1e8._0_8_ * 8 + 1);
        }
        else {
          ppvVar2 = &(((HostRead<int> *)(local_1e8._0_8_ + 0x28))->read_).write_.shared_alloc_.
                     direct_ptr;
          *(int *)ppvVar2 = *(int *)ppvVar2 + 1;
        }
      }
      local_140.write_.shared_alloc_.direct_ptr = (void *)local_1e8._8_8_;
      local_150.write_.shared_alloc_.alloc = local_228;
      if (((ulong)local_228 & 7) == 0 && local_228 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_150.write_.shared_alloc_.alloc = (Alloc *)(local_228->size * 8 + 1);
        }
        else {
          local_228->use_count = local_228->use_count + 1;
        }
      }
      local_150.write_.shared_alloc_.direct_ptr = local_220;
      local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"");
      multiply_each<double>((Omega_h *)&local_50,&local_140,&local_150,&local_2a8);
      Read<double>::Read((Read<signed_char> *)local_258,&local_50);
      pAVar18 = (pRVar10->write_).shared_alloc_.alloc;
      uVar17 = extraout_RDX_01;
      if (((ulong)pAVar18 & 7) == 0 && pAVar18 != (Alloc *)0x0) {
        piVar3 = &pAVar18->use_count;
        *piVar3 = *piVar3 + -1;
        if (*piVar3 == 0) {
          Alloc::~Alloc(pAVar18);
          operator_delete(pAVar18,0x48);
          uVar17 = extraout_RDX_02;
        }
      }
      (local_230->write_).shared_alloc_.alloc = (Alloc *)local_258._0_8_;
      (local_230->write_).shared_alloc_.direct_ptr = (void *)local_258._8_8_;
      uVar17 = uVar17 & 0xffffffffffffff00;
      if (((local_258._0_8_ & 7) == 0 && (Comm *)local_258._0_8_ != (Comm *)0x0) &&
         (entering_parallel == '\x01')) {
        ppvVar2 = &(((HostRead<int> *)(local_258._0_8_ + 0x28))->read_).write_.shared_alloc_.
                   direct_ptr;
        *(int *)ppvVar2 = *(int *)ppvVar2 + -1;
        (local_230->write_).shared_alloc_.alloc =
             (Alloc *)((long)*(Library **)local_258._0_8_ * 8 + 1);
      }
      local_258._0_8_ = (Alloc *)0x0;
      local_258._8_8_ = (element_type *)0x0;
      if (((ulong)local_50.shared_alloc_.alloc & 7) == 0 &&
          local_50.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar3 = &(local_50.shared_alloc_.alloc)->use_count;
        *piVar3 = *piVar3 + -1;
        if (*piVar3 == 0) {
          Alloc::~Alloc(local_50.shared_alloc_.alloc);
          operator_delete(local_50.shared_alloc_.alloc,0x48);
          uVar17 = extraout_RDX_03;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p,
                        (ulong)(local_2a8.field_2._M_allocated_capacity + 1));
        uVar17 = extraout_RDX_04;
      }
      pAVar18 = local_150.write_.shared_alloc_.alloc;
      if (((ulong)local_150.write_.shared_alloc_.alloc & 7) == 0 &&
          local_150.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)local_150.write_.shared_alloc_.alloc + 0x30);
        *(int *)&p_Var5->_vptr__Sp_counted_base = *(int *)&p_Var5->_vptr__Sp_counted_base + -1;
        if (*(int *)&p_Var5->_vptr__Sp_counted_base == 0) {
          Alloc::~Alloc(local_150.write_.shared_alloc_.alloc);
          operator_delete(pAVar18,0x48);
          uVar17 = extraout_RDX_05;
        }
      }
      pAVar18 = local_140.write_.shared_alloc_.alloc;
      if (((ulong)local_140.write_.shared_alloc_.alloc & 7) == 0 &&
          (Comm *)local_140.write_.shared_alloc_.alloc != (Comm *)0x0) {
        p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)local_140.write_.shared_alloc_.alloc + 0x30);
        *(int *)&p_Var5->_vptr__Sp_counted_base = *(int *)&p_Var5->_vptr__Sp_counted_base + -1;
        if (*(int *)&p_Var5->_vptr__Sp_counted_base == 0) {
          Alloc::~Alloc(local_140.write_.shared_alloc_.alloc);
          operator_delete(pAVar18,0x48);
          uVar17 = extraout_RDX_06;
        }
      }
      uVar7 = local_1e8._0_8_;
      pAVar18 = (local_230->write_).shared_alloc_.alloc;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)mesh)->_vptr__Sp_counted_base =
           (_func_int **)pAVar18;
      (((CommPtr *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)mesh)->_M_use_count)->
      super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           (element_type *)(local_230->write_).shared_alloc_.direct_ptr;
      bVar21 = ((ulong)pAVar18 & 7) != 0;
      error_integrals = (Reals *)CONCAT71((int7)(uVar17 >> 8),bVar21 || pAVar18 == (Alloc *)0x0);
      if ((!bVar21 && pAVar18 != (Alloc *)0x0) && (entering_parallel == '\x01')) {
        pAVar18->use_count = pAVar18->use_count + -1;
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)mesh)->_vptr__Sp_counted_base =
             (_func_int **)(pAVar18->size * 8 + 1);
      }
      (local_230->write_).shared_alloc_.alloc = (Alloc *)0x0;
      (local_230->write_).shared_alloc_.direct_ptr = (void *)0x0;
      pAVar18 = local_228;
      if ((local_1e8._0_8_ & 7) == 0 && (Comm *)local_1e8._0_8_ != (Comm *)0x0) {
        ppvVar2 = &(((HostRead<int> *)(local_1e8._0_8_ + 0x28))->read_).write_.shared_alloc_.
                   direct_ptr;
        *(int *)ppvVar2 = *(int *)ppvVar2 + -1;
        if (*(int *)ppvVar2 == 0) {
          Alloc::~Alloc((Alloc *)local_1e8._0_8_);
          operator_delete((void *)uVar7,0x48);
          error_integrals = extraout_RDX_07;
          pAVar18 = local_228;
        }
      }
    }
    else {
      pAVar18 = (quantity_integrals->write_).shared_alloc_.alloc;
      if (((ulong)pAVar18 & 1) == 0) {
        sVar19 = pAVar18->size;
      }
      else {
        sVar19 = (ulong)pAVar18 >> 3;
      }
      local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"");
      Write<double>::Write(&local_208,(LO)(sVar19 >> 3),&local_2a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p,
                        (ulong)(local_2a8.field_2._M_allocated_capacity + 1));
      }
      local_1c8._16_4_ = 1;
      if (1 < ncomps) {
        local_1c8._16_4_ = ncomps;
      }
      __val = 0;
      local_210 = &local_278;
      local_218 = (Omega_h *)&local_1f8;
      do {
        local_d0.write_.shared_alloc_.alloc = (local_230->write_).shared_alloc_.alloc;
        if (((ulong)local_d0.write_.shared_alloc_.alloc & 7) == 0 &&
            local_d0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_d0.write_.shared_alloc_.alloc =
                 (Alloc *)((local_d0.write_.shared_alloc_.alloc)->size * 8 + 1);
          }
          else {
            (local_d0.write_.shared_alloc_.alloc)->use_count =
                 (local_d0.write_.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_d0.write_.shared_alloc_.direct_ptr = (local_230->write_).shared_alloc_.direct_ptr;
        get_component<double>((Omega_h *)&local_278,&local_d0,ncomps,__val);
        pAVar18 = local_d0.write_.shared_alloc_.alloc;
        if (((ulong)local_d0.write_.shared_alloc_.alloc & 7) == 0 &&
            local_d0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)local_d0.write_.shared_alloc_.alloc + 0x30);
          *(int *)&p_Var5->_vptr__Sp_counted_base = *(int *)&p_Var5->_vptr__Sp_counted_base + -1;
          if (*(int *)&p_Var5->_vptr__Sp_counted_base == 0) {
            Alloc::~Alloc(local_d0.write_.shared_alloc_.alloc);
            operator_delete(pAVar18,0x48);
          }
        }
        local_e0.write_.shared_alloc_.alloc = (Alloc *)((_Alloc_hider *)&local_280->library_)->_M_p;
        if (((ulong)local_e0.write_.shared_alloc_.alloc & 7) == 0 &&
            local_e0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_e0.write_.shared_alloc_.alloc =
                 (Alloc *)((local_e0.write_.shared_alloc_.alloc)->size * 8 + 1);
          }
          else {
            (local_e0.write_.shared_alloc_.alloc)->use_count =
                 (local_e0.write_.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_e0.write_.shared_alloc_.direct_ptr = (local_280->srcs_).write_.shared_alloc_.alloc;
        get_component<double>((Omega_h *)&local_1f8,&local_e0,ncomps,__val);
        pAVar18 = local_e0.write_.shared_alloc_.alloc;
        if (((ulong)local_e0.write_.shared_alloc_.alloc & 7) == 0 &&
            local_e0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)local_e0.write_.shared_alloc_.alloc + 0x30);
          *(int *)&p_Var5->_vptr__Sp_counted_base = *(int *)&p_Var5->_vptr__Sp_counted_base + -1;
          if (*(int *)&p_Var5->_vptr__Sp_counted_base == 0) {
            Alloc::~Alloc(local_e0.write_.shared_alloc_.alloc);
            operator_delete(pAVar18,0x48);
          }
        }
        local_258._0_8_ = local_258 + 0x10;
        pAVar18 = (local_158->super_Graph).a2ab.write_.shared_alloc_.alloc;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_258,pAVar18,
                   (long)(local_158->super_Graph).a2ab.write_.shared_alloc_.direct_ptr +
                   (long)pAVar18);
        std::__cxx11::string::append((char *)local_258);
        __len = 1;
        if (9 < __val) {
          uVar17 = (ulong)__val;
          uVar11 = 4;
          do {
            __len = uVar11;
            uVar13 = (uint)uVar17;
            if (uVar13 < 100) {
              __len = __len - 2;
              goto LAB_002864e8;
            }
            if (uVar13 < 1000) {
              __len = __len - 1;
              goto LAB_002864e8;
            }
            if (uVar13 < 10000) goto LAB_002864e8;
            uVar17 = uVar17 / 10000;
            uVar11 = __len + 4;
          } while (99999 < uVar13);
          __len = __len + 1;
        }
LAB_002864e8:
        local_1d8 = (Alloc *)local_1c8;
        std::__cxx11::string::_M_construct((ulong)&local_1d8,(char)__len);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1d8,__len,__val);
        pAVar18 = (Alloc *)0xf;
        if ((Comm *)local_258._0_8_ != (Comm *)(local_258 + 0x10)) {
          pAVar18 = (Alloc *)local_258._16_8_;
        }
        pAVar4 = (Alloc *)((long)&(local_1d0->
                                  super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                                  )._M_ptr + (long)&((_Alloc_hider *)local_258._8_8_)->_M_p);
        if (pAVar18 < pAVar4) {
          pAVar18 = (Alloc *)0xf;
          if (local_1d8 != (Alloc *)local_1c8) {
            pAVar18 = (Alloc *)local_1c8._0_8_;
          }
          if (pAVar18 < pAVar4) goto LAB_0028657c;
          puVar15 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,local_258._0_8_);
        }
        else {
LAB_0028657c:
          puVar15 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)local_258,(ulong)local_1d8);
        }
        local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
        plVar1 = puVar15 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar15 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar1) {
          local_2a8.field_2._M_allocated_capacity = *plVar1;
          local_2a8.field_2._8_8_ = puVar15[3];
        }
        else {
          local_2a8.field_2._M_allocated_capacity = *plVar1;
          local_2a8._M_dataplus._M_p = (pointer)*puVar15;
        }
        local_2a8._M_string_length = puVar15[1];
        *puVar15 = plVar1;
        puVar15[1] = 0;
        *(undefined1 *)plVar1 = 0;
        if (local_1d8 != (Alloc *)local_1c8) {
          operator_delete(local_1d8,
                          (ulong)((long)&(((Graph *)local_1c8._0_8_)->a2ab).write_.shared_alloc_.
                                         alloc + 1));
        }
        if ((Comm *)local_258._0_8_ != (Comm *)(local_258 + 0x10)) {
          operator_delete((void *)local_258._0_8_,(ulong)((long)(_func_int ***)local_258._16_8_ + 1)
                         );
        }
        local_70.write_.shared_alloc_.alloc = (error_integrals->write_).shared_alloc_.alloc;
        if (((ulong)local_70.write_.shared_alloc_.alloc & 7) == 0 &&
            local_70.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_70.write_.shared_alloc_.alloc =
                 (Alloc *)((local_70.write_.shared_alloc_.alloc)->size * 8 + 1);
          }
          else {
            (local_70.write_.shared_alloc_.alloc)->use_count =
                 (local_70.write_.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_70.write_.shared_alloc_.direct_ptr =
             (error_integrals->write_).shared_alloc_.direct_ptr;
        local_60 = error_integrals[1].write_.shared_alloc_.alloc;
        if (((ulong)local_60 & 7) == 0 && local_60 != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_60 = (Alloc *)(local_60->size * 8 + 1);
          }
          else {
            local_60->use_count = local_60->use_count + 1;
          }
        }
        local_58 = (Alloc *)error_integrals[1].write_.shared_alloc_.direct_ptr;
        local_100.field_2._M_allocated_capacity =
             (size_type)
             local_278.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        if (((ulong)local_278.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr & 7) == 0 &&
            (Comm *)local_278.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr != (Comm *)0x0) {
          if (entering_parallel == '\x01') {
            local_100.field_2._M_allocated_capacity =
                 (long)(local_278.
                        super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->_vptr_TagBase * 8 + 1;
          }
          else {
            ppvVar2 = &(((HostRead<int> *)
                        &(local_278.
                          super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->ncomps_)->read_).write_.shared_alloc_.direct_ptr;
            *(int *)ppvVar2 = *(int *)ppvVar2 + 1;
          }
        }
        local_100.field_2._8_8_ =
             local_278.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        local_100._M_dataplus._M_p = (pointer)local_1f8;
        if (((ulong)local_1f8 & 7) == 0 && local_1f8 != (Comm *)0x0) {
          if (entering_parallel == '\x01') {
            local_100._M_dataplus._M_p = (pointer)((long)local_1f8->library_ * 8 + 1);
          }
          else {
            ppvVar2 = &(local_1f8->host_srcs_).read_.write_.shared_alloc_.direct_ptr;
            *(int *)ppvVar2 = *(int *)ppvVar2 + 1;
          }
        }
        local_100._M_string_length = (size_type)local_1f0;
        diffuse_integrals_weighted
                  ((Mesh *)local_258,(Graph *)local_1c8._24_8_,&local_70,(Reals *)&local_100.field_2
                   ,opts,&local_100,SUB81(&local_2a8,0));
        peVar8 = local_278.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        if (((ulong)local_278.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr & 7) == 0 &&
            (Comm *)local_278.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr != (Comm *)0x0) {
          ppvVar2 = &(((HostRead<int> *)
                      &(local_278.
                        super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->ncomps_)->read_).write_.shared_alloc_.direct_ptr;
          *(int *)ppvVar2 = *(int *)ppvVar2 + -1;
          if (*(int *)ppvVar2 == 0) {
            Alloc::~Alloc((Alloc *)local_278.
                                   super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
            operator_delete(peVar8,0x48);
          }
        }
        local_278.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_258._0_8_;
        local_278.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_;
        if (((local_258._0_8_ & 7) == 0 && (Comm *)local_258._0_8_ != (Comm *)0x0) &&
           (entering_parallel == '\x01')) {
          ppvVar2 = &(((HostRead<int> *)(local_258._0_8_ + 0x28))->read_).write_.shared_alloc_.
                     direct_ptr;
          *(int *)ppvVar2 = *(int *)ppvVar2 + -1;
          local_278.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)((long)*(Library **)local_258._0_8_ * 8 + 1);
        }
        _Var6._M_p = local_100._M_dataplus._M_p;
        local_258._0_8_ = (Alloc *)0x0;
        local_258._8_8_ = (element_type *)0x0;
        if (((ulong)local_100._M_dataplus._M_p & 7) == 0 &&
            (Comm *)local_100._M_dataplus._M_p != (Comm *)0x0) {
          p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   (local_100._M_dataplus._M_p + 0x30);
          *(int *)&p_Var5->_vptr__Sp_counted_base = *(int *)&p_Var5->_vptr__Sp_counted_base + -1;
          if (*(int *)&p_Var5->_vptr__Sp_counted_base == 0) {
            Alloc::~Alloc((Alloc *)local_100._M_dataplus._M_p);
            operator_delete(_Var6._M_p,0x48);
          }
        }
        uVar7 = local_100.field_2._M_allocated_capacity;
        if ((local_100.field_2._M_allocated_capacity & 7) == 0 &&
            (Comm *)local_100.field_2._M_allocated_capacity != (Comm *)0x0) {
          p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   (local_100.field_2._M_allocated_capacity + 0x30);
          *(int *)&p_Var5->_vptr__Sp_counted_base = *(int *)&p_Var5->_vptr__Sp_counted_base + -1;
          if (*(int *)&p_Var5->_vptr__Sp_counted_base == 0) {
            Alloc::~Alloc((Alloc *)uVar7);
            operator_delete((void *)uVar7,0x48);
          }
        }
        pAVar18 = local_60;
        if (((ulong)local_60 & 7) == 0 && local_60 != (Alloc *)0x0) {
          piVar3 = &local_60->use_count;
          *piVar3 = *piVar3 + -1;
          if (*piVar3 == 0) {
            Alloc::~Alloc(local_60);
            operator_delete(pAVar18,0x48);
          }
        }
        pAVar18 = local_70.write_.shared_alloc_.alloc;
        if (((ulong)local_70.write_.shared_alloc_.alloc & 7) == 0 &&
            local_70.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar3 = &(local_70.write_.shared_alloc_.alloc)->use_count;
          *piVar3 = *piVar3 + -1;
          if (*piVar3 == 0) {
            Alloc::~Alloc(local_70.write_.shared_alloc_.alloc);
            operator_delete(pAVar18,0x48);
          }
        }
        local_110.shared_alloc_.alloc = local_208.shared_alloc_.alloc;
        if (((ulong)local_208.shared_alloc_.alloc & 7) == 0 &&
            local_208.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_110.shared_alloc_.alloc = (Alloc *)((local_208.shared_alloc_.alloc)->size * 8 + 1)
            ;
          }
          else {
            (local_208.shared_alloc_.alloc)->use_count =
                 (local_208.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_110.shared_alloc_.direct_ptr = local_208.shared_alloc_.direct_ptr;
        local_120.write_.shared_alloc_.alloc =
             (Alloc *)local_278.
                      super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (((ulong)local_278.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr & 7) == 0 &&
            (Comm *)local_278.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr != (Comm *)0x0) {
          if (entering_parallel == '\x01') {
            local_120.write_.shared_alloc_.alloc =
                 (Alloc *)((long)(local_278.
                                  super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_TagBase * 8 + 1);
          }
          else {
            ppvVar2 = &(((HostRead<int> *)
                        &(local_278.
                          super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->ncomps_)->read_).write_.shared_alloc_.direct_ptr;
            *(int *)ppvVar2 = *(int *)ppvVar2 + 1;
          }
        }
        local_120.write_.shared_alloc_.direct_ptr =
             local_278.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        set_component<double>(&local_110,&local_120,ncomps,__val);
        pAVar18 = local_120.write_.shared_alloc_.alloc;
        if (((ulong)local_120.write_.shared_alloc_.alloc & 7) == 0 &&
            (Comm *)local_120.write_.shared_alloc_.alloc != (Comm *)0x0) {
          p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)local_120.write_.shared_alloc_.alloc + 0x30);
          *(int *)&p_Var5->_vptr__Sp_counted_base = *(int *)&p_Var5->_vptr__Sp_counted_base + -1;
          if (*(int *)&p_Var5->_vptr__Sp_counted_base == 0) {
            Alloc::~Alloc(pAVar18);
            operator_delete(pAVar18,0x48);
          }
        }
        pAVar18 = local_110.shared_alloc_.alloc;
        if (((ulong)local_110.shared_alloc_.alloc & 7) == 0 &&
            local_110.shared_alloc_.alloc != (Alloc *)0x0) {
          p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)local_110.shared_alloc_.alloc + 0x30);
          *(int *)&p_Var5->_vptr__Sp_counted_base = *(int *)&p_Var5->_vptr__Sp_counted_base + -1;
          if (*(int *)&p_Var5->_vptr__Sp_counted_base == 0) {
            Alloc::~Alloc(local_110.shared_alloc_.alloc);
            operator_delete(pAVar18,0x48);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          operator_delete(local_2a8._M_dataplus._M_p,
                          (ulong)(local_2a8.field_2._M_allocated_capacity + 1));
        }
        pCVar20 = local_1f8;
        if (((ulong)local_1f8 & 7) == 0 && local_1f8 != (Comm *)0x0) {
          ppvVar2 = &(local_1f8->host_srcs_).read_.write_.shared_alloc_.direct_ptr;
          *(int *)ppvVar2 = *(int *)ppvVar2 + -1;
          if (*(int *)ppvVar2 == 0) {
            Alloc::~Alloc((Alloc *)local_1f8);
            operator_delete(pCVar20,0x48);
          }
        }
        peVar8 = local_278.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        if (((ulong)local_278.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr & 7) == 0 &&
            (Comm *)local_278.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr != (Comm *)0x0) {
          ppvVar2 = &(((HostRead<int> *)
                      &(local_278.
                        super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->ncomps_)->read_).write_.shared_alloc_.direct_ptr;
          *(int *)ppvVar2 = *(int *)ppvVar2 + -1;
          if (*(int *)ppvVar2 == 0) {
            Alloc::~Alloc((Alloc *)local_278.
                                   super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
            operator_delete(peVar8,0x48);
          }
        }
        mesh = (Mesh *)local_160._M_pi;
        __val = __val + 1;
      } while (__val != local_1c8._16_4_);
      local_130.shared_alloc_.alloc = local_208.shared_alloc_.alloc;
      local_130.shared_alloc_.direct_ptr = local_208.shared_alloc_.direct_ptr;
      if ((((ulong)local_208.shared_alloc_.alloc & 7) == 0 &&
           local_208.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
        (local_208.shared_alloc_.alloc)->use_count = (local_208.shared_alloc_.alloc)->use_count + -1
        ;
        local_130.shared_alloc_.alloc = (Alloc *)((local_208.shared_alloc_.alloc)->size * 8 + 1);
      }
      local_208.shared_alloc_.alloc = (Alloc *)0x0;
      local_208.shared_alloc_.direct_ptr = (element_type *)0x0;
      Read<double>::Read((Read<signed_char> *)local_160._M_pi,&local_130);
      pAVar4 = local_130.shared_alloc_.alloc;
      error_integrals = extraout_RDX;
      pAVar18 = local_208.shared_alloc_.alloc;
      if (((ulong)local_130.shared_alloc_.alloc & 7) == 0 &&
          local_130.shared_alloc_.alloc != (Alloc *)0x0) {
        p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)local_130.shared_alloc_.alloc + 0x30);
        *(int *)&p_Var5->_vptr__Sp_counted_base = *(int *)&p_Var5->_vptr__Sp_counted_base + -1;
        if (*(int *)&p_Var5->_vptr__Sp_counted_base == 0) {
          Alloc::~Alloc(local_130.shared_alloc_.alloc);
          operator_delete(pAVar4,0x48);
          error_integrals = extraout_RDX_00;
          pAVar18 = local_208.shared_alloc_.alloc;
        }
      }
    }
    if (((ulong)pAVar18 & 7) == 0 && pAVar18 != (Alloc *)0x0) {
      piVar3 = &pAVar18->use_count;
      *piVar3 = *piVar3 + -1;
      if (*piVar3 == 0) {
        Alloc::~Alloc(pAVar18);
        operator_delete(pAVar18,0x48);
        error_integrals = extraout_RDX_08;
      }
    }
  }
  RVar22.write_.shared_alloc_.direct_ptr = error_integrals;
  RVar22.write_.shared_alloc_.alloc = (Alloc *)mesh;
  return (Reals)RVar22.write_.shared_alloc_;
}

Assistant:

static Reals diffuse_integrals_weighted(Mesh* mesh, Graph g,
    Reals error_integrals, Reals quantity_integrals, VarCompareOpts opts,
    std::string const& name, bool verbose) {
  if (opts.type == VarCompareOpts::NONE) return error_integrals;
  auto ncomps = divide_no_remainder(error_integrals.size(), g.nnodes());
  if (ncomps > 1) {
    Write<Real> out(error_integrals.size());
    for (Int c = 0; c < ncomps; ++c) {
      auto comp_integrals = get_component(error_integrals, ncomps, c);
      auto comp_quantity_integrals =
          get_component(quantity_integrals, ncomps, c);
      auto comp_name = name + "_" + std::to_string(c);
      comp_integrals = diffuse_integrals_weighted(mesh, g, comp_integrals,
          comp_quantity_integrals, opts, comp_name, verbose);
      set_component(out, comp_integrals, ncomps, c);
    }
    return out;
  }
  auto weighted_sizes = fabs_each(quantity_integrals);
  weighted_sizes = each_max_with(weighted_sizes, opts.floor);
  auto weighted_densities =
      divide_each_maybe_zero(error_integrals, weighted_sizes);
  weighted_densities = diffuse_densities(
      mesh, g, weighted_densities, weighted_sizes, opts, name, verbose);
  error_integrals = multiply_each(weighted_densities, weighted_sizes);
  return error_integrals;
}